

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O1

lzma_ret hash_append(lzma_index_hash_info *info,lzma_vli unpadded_size,lzma_vli uncompressed_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  lzma_ret extraout_EAX;
  lzma_vli sizes [2];
  lzma_vli local_28;
  lzma_vli local_20;
  
  local_28 = unpadded_size;
  local_20 = uncompressed_size;
  if (-1 < (long)unpadded_size) {
    info->blocks_size = info->blocks_size + (unpadded_size + 3 & 0xfffffffffffffffc);
    info->uncompressed_size = info->uncompressed_size + uncompressed_size;
    uVar1 = lzma_vli_size(unpadded_size);
    uVar2 = lzma_vli_size(uncompressed_size);
    info->index_list_size = info->index_list_size + (ulong)(uVar2 + uVar1);
    info->count = info->count + 1;
    lzma_check_update(&info->check,LZMA_CHECK_SHA256,(uint8_t *)&local_28,0x10);
    return extraout_EAX;
  }
  __assert_fail("vli <= LZMA_VLI_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
}

Assistant:

static lzma_ret
hash_append(lzma_index_hash_info *info, lzma_vli unpadded_size,
		lzma_vli uncompressed_size)
{
	const lzma_vli sizes[2] = { unpadded_size, uncompressed_size };

	info->blocks_size += vli_ceil4(unpadded_size);
	info->uncompressed_size += uncompressed_size;
	info->index_list_size += lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);
	++info->count;

	lzma_check_update(&info->check, LZMA_CHECK_BEST,
			(const uint8_t *)(sizes), sizeof(sizes));

	return LZMA_OK;
}